

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::MergeFromImpl
          (MessageLite *this,CodedInputStream *input,ParseFlags parse_flags)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  TcParseTableBase *table;
  ulong uVar4;
  Nullable<const_char_*> failure_msg;
  ParseFlags extraout_EDX;
  ParseFlags extraout_EDX_00;
  ParseFlags parse_flags_00;
  char *ptr;
  ParseContext ctx;
  ZeroCopyCodedInputStream zcis;
  LogMessageFatal local_d0;
  ZeroCopyCodedInputStream *local_c0;
  ParseFlags local_b8;
  uint local_b4;
  ParseContext local_b0;
  ZeroCopyCodedInputStream local_40;
  
  local_d0.super_LogMessage._0_8_ = &local_40;
  local_40.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream =
       (_func_int **)&PTR__ZeroCopyInputStream_00547620;
  local_b8 = parse_flags;
  local_40.cis_ = input;
  internal::ParseContext::ParseContext<google::protobuf::ZeroCopyCodedInputStream*>
            (&local_b0,input->recursion_budget_,input->aliasing_enabled_,(char **)&local_c0,
             (ZeroCopyCodedInputStream **)&local_d0);
  local_b0.group_depth_ = 0;
  local_b0.data_.pool = input->extension_pool_;
  local_b0.data_.factory = input->extension_factory_;
  table = GetTcParseTable(this);
  local_d0.super_LogMessage._0_8_ = local_c0;
  while (bVar2 = internal::ParseContext::Done(&local_b0,(char **)&local_d0), !bVar2) {
    uVar1 = *(ushort *)
             &((ZeroCopyInputStream *)local_d0.super_LogMessage._0_8_)->_vptr_ZeroCopyInputStream;
    uVar3 = (uint)table->fast_idx_mask & (uint)uVar1;
    if ((uVar3 & 7) != 0) {
      internal::protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar4 = (ulong)(uVar3 & 0xfffffff8);
    local_d0.super_LogMessage._0_8_ =
         (**(code **)(&table[1].has_bits_offset + uVar4))
                   (this,local_d0.super_LogMessage._0_8_,&local_b0,
                    (ulong)uVar1 ^ *(ulong *)(&table[1].fast_idx_mask + uVar4 * 2),table,0);
    if (((ZeroCopyCodedInputStream *)local_d0.super_LogMessage._0_8_ ==
         (ZeroCopyCodedInputStream *)0x0) ||
       (local_b0.super_EpsCopyInputStream.last_tag_minus_1_ != 0)) break;
  }
  if ((table->field_0x9 & 1) == 0) {
    local_c0 = (ZeroCopyCodedInputStream *)local_d0.super_LogMessage._0_8_;
    if ((ZeroCopyCodedInputStream *)local_d0.super_LogMessage._0_8_ ==
        (ZeroCopyCodedInputStream *)0x0) {
      internal::TcParser::VerifyHasBitConsistency(this,table);
      local_c0 = (ZeroCopyCodedInputStream *)local_d0.super_LogMessage._0_8_;
      goto LAB_0025d5cc;
    }
LAB_0025d50b:
    internal::EpsCopyInputStream::BackUp(&local_b0.super_EpsCopyInputStream,(char *)local_c0);
    if (local_b0.super_EpsCopyInputStream.last_tag_minus_1_ == 1) {
      input->legitimate_message_end_ = true;
      parse_flags_00 = extraout_EDX;
    }
    else {
      local_d0.super_LogMessage.errno_saver_.saved_errno_ =
           local_b0.super_EpsCopyInputStream.last_tag_minus_1_ + 1;
      local_b4 = 1;
      failure_msg = absl::lts_20250127::log_internal::Check_NEImpl<unsigned_int,unsigned_int>
                              ((uint *)&local_d0,&local_b4,"ctx.LastTag() != 1u");
      if (failure_msg != (Nullable<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_d0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
                   ,0x14e,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_d0);
      }
      if ((local_b0.super_EpsCopyInputStream.limit_end_ < local_c0) &&
         ((local_b0.super_EpsCopyInputStream.next_chunk_ == (char *)0x0 ||
          ((long)local_b0.super_EpsCopyInputStream.limit_ <
           (long)local_c0 - (long)local_b0.super_EpsCopyInputStream.buffer_end_))))
      goto LAB_0025d575;
      input->last_tag_ = local_b0.super_EpsCopyInputStream.last_tag_minus_1_ + 1;
      parse_flags_00 = extraout_EDX_00;
    }
    bVar2 = anon_unknown_15::CheckFieldPresence
                      ((ParseContext *)this,(MessageLite *)(ulong)local_b8,parse_flags_00);
  }
  else {
    local_c0 = (ZeroCopyCodedInputStream *)
               (*table->post_loop_handler)(this,(char *)local_d0.super_LogMessage._0_8_,&local_b0);
LAB_0025d5cc:
    if (local_c0 != (ZeroCopyCodedInputStream *)0x0) goto LAB_0025d50b;
LAB_0025d575:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool MessageLite::MergeFromImpl(io::CodedInputStream* input,
                                MessageLite::ParseFlags parse_flags) {
  ZeroCopyCodedInputStream zcis(input);
  const char* ptr;
  internal::ParseContext ctx(input->RecursionBudget(), zcis.aliasing_enabled(),
                             &ptr, &zcis);
  // MergePartialFromCodedStream allows terminating the wireformat by 0 or
  // end-group tag. Leaving it up to the caller to verify correct ending by
  // calling LastTagWas on input. We need to maintain this behavior.
  ctx.TrackCorrectEnding();
  ctx.data().pool = input->GetExtensionPool();
  ctx.data().factory = input->GetExtensionFactory();
  ptr = internal::TcParser::ParseLoop(this, ptr, &ctx, GetTcParseTable());
  if (ABSL_PREDICT_FALSE(!ptr)) return false;
  ctx.BackUp(ptr);
  if (!ctx.EndedAtEndOfStream()) {
    ABSL_DCHECK_NE(ctx.LastTag(), 1u);  // We can't end on a pushed limit.
    if (ctx.IsExceedingLimit(ptr)) return false;
    input->SetLastTag(ctx.LastTag());
  } else {
    input->SetConsumed();
  }
  return CheckFieldPresence(ctx, *this, parse_flags);
}